

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

void re2::PatchList::Patch(Inst *inst0,PatchList l,uint32 val)

{
  Inst *this;
  Inst *ip;
  uint32 val_local;
  Inst *inst0_local;
  PatchList l_local;
  
  inst0_local._4_4_ = l.p;
  while (inst0_local._4_4_ != 0) {
    this = inst0 + (inst0_local._4_4_ >> 1);
    if ((inst0_local._4_4_ & 1) == 0) {
      inst0_local._4_4_ = Prog::Inst::out(this);
      Prog::Inst::set_out(this,val);
    }
    else {
      inst0_local._4_4_ = Prog::Inst::out1(this);
      (this->field_1).out1_ = val;
    }
  }
  return;
}

Assistant:

void PatchList::Patch(Prog::Inst *inst0, PatchList l, uint32 val) {
  while (l.p != 0) {
    Prog::Inst* ip = &inst0[l.p>>1];
    if (l.p&1) {
      l.p = ip->out1();
      ip->out1_ = val;
    } else {
      l.p = ip->out();
      ip->set_out(val);
    }
  }
}